

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::RepeatedField
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  int iVar1;
  void *pvVar2;
  void **ppvVar3;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  ppvVar3 = (void **)((long)other->arena_or_elements_ + -8);
  if (other->total_size_ == 0) {
    ppvVar3 = &other->arena_or_elements_;
  }
  if (*ppvVar3 == (void *)0x0) {
    pvVar2 = this->arena_or_elements_;
    this->arena_or_elements_ = other->arena_or_elements_;
    other->arena_or_elements_ = pvVar2;
    iVar1 = this->current_size_;
    this->current_size_ = other->current_size_;
    other->current_size_ = iVar1;
    iVar1 = this->total_size_;
    this->total_size_ = other->total_size_;
    other->total_size_ = iVar1;
  }
  else if (other != this) {
    this->current_size_ = 0;
    if (other->current_size_ != 0) {
      Reserve(this,other->current_size_);
      this->current_size_ = this->current_size_ + other->current_size_;
      memcpy(this->arena_or_elements_,other->arena_or_elements_,(long)other->current_size_ << 3);
      return;
    }
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(RepeatedField&& other) noexcept
    : RepeatedField() {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // other is on an arena. This field can't be on an arena because arena
  // construction always uses the Arena* accepting constructor.
  if (other.GetArenaNoVirtual()) {
    CopyFrom(other);
  } else {
    InternalSwap(&other);
  }
}